

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::SeparationPart::operator==(SeparationPart *this,SeparationPart *Value)

{
  KBOOL KVar1;
  SeparationPart *Value_local;
  SeparationPart *this_local;
  
  if ((this->super_VariableParameter).m_ui8VarParamType ==
      (Value->super_VariableParameter).m_ui8VarParamType) {
    if (this->m_ui8Reason == Value->m_ui8Reason) {
      if (this->m_ui8PreEntIndicator == Value->m_ui8PreEntIndicator) {
        KVar1 = EntityIdentifier::operator!=(&this->m_ParentEntId,&Value->m_ParentEntId);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = NamedLocationIdentifier::operator!=(&this->m_StationLoc,&Value->m_StationLoc);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL SeparationPart::operator == ( const SeparationPart & Value ) const
{
    if ( m_ui8VarParamType != Value.m_ui8VarParamType)        return false;
    if ( m_ui8Reason != Value.m_ui8Reason )                   return false;
    if ( m_ui8PreEntIndicator != Value.m_ui8PreEntIndicator ) return false;
    if ( m_ParentEntId != Value.m_ParentEntId )               return false;
    if ( m_StationLoc != Value.m_StationLoc )                 return false;
    return true;
}